

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O2

void __thiscall Kvm::initialize(Kvm *this)

{
  Kgc *this_00;
  Value *pVVar1;
  allocator<char> local_31;
  string local_30;
  
  pVVar1 = makeNil(this);
  this->NIL = pVVar1;
  this_00 = &this->gc_;
  Kgc::pushStackRoot(this_00,pVVar1);
  pVVar1 = makeBool(this,false);
  this->FALSE = pVVar1;
  Kgc::pushStackRoot(this_00,pVVar1);
  pVVar1 = makeBool(this,true);
  this->TRUE = pVVar1;
  Kgc::pushStackRoot(this_00,pVVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"quote",&local_31);
  pVVar1 = makeSymbol(this,&local_30);
  this->QUOTE = pVVar1;
  std::__cxx11::string::~string((string *)&local_30);
  Kgc::pushStackRoot(this_00,this->QUOTE);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"define",&local_31);
  pVVar1 = makeSymbol(this,&local_30);
  this->DEFINE = pVVar1;
  std::__cxx11::string::~string((string *)&local_30);
  Kgc::pushStackRoot(this_00,this->DEFINE);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"set!",&local_31);
  pVVar1 = makeSymbol(this,&local_30);
  this->SET = pVVar1;
  std::__cxx11::string::~string((string *)&local_30);
  Kgc::pushStackRoot(this_00,this->SET);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"ok",&local_31);
  pVVar1 = makeSymbol(this,&local_30);
  this->OK = pVVar1;
  std::__cxx11::string::~string((string *)&local_30);
  Kgc::pushStackRoot(this_00,this->OK);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"if",&local_31);
  pVVar1 = makeSymbol(this,&local_30);
  this->IF = pVVar1;
  std::__cxx11::string::~string((string *)&local_30);
  Kgc::pushStackRoot(this_00,this->IF);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"lambda",&local_31);
  pVVar1 = makeSymbol(this,&local_30);
  this->LAMBDA = pVVar1;
  std::__cxx11::string::~string((string *)&local_30);
  Kgc::pushStackRoot(this_00,this->LAMBDA);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"begin",&local_31);
  pVVar1 = makeSymbol(this,&local_30);
  this->BEGIN = pVVar1;
  std::__cxx11::string::~string((string *)&local_30);
  Kgc::pushStackRoot(this_00,this->BEGIN);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"cond",&local_31);
  pVVar1 = makeSymbol(this,&local_30);
  this->COND = pVVar1;
  std::__cxx11::string::~string((string *)&local_30);
  Kgc::pushStackRoot(this_00,this->COND);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"else",&local_31);
  pVVar1 = makeSymbol(this,&local_30);
  this->ELSE = pVVar1;
  std::__cxx11::string::~string((string *)&local_30);
  Kgc::pushStackRoot(this_00,this->ELSE);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"let",&local_31);
  pVVar1 = makeSymbol(this,&local_30);
  this->LET = pVVar1;
  std::__cxx11::string::~string((string *)&local_30);
  Kgc::pushStackRoot(this_00,this->LET);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"and",&local_31);
  pVVar1 = makeSymbol(this,&local_30);
  this->AND = pVVar1;
  std::__cxx11::string::~string((string *)&local_30);
  Kgc::pushStackRoot(this_00,this->AND);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"or",&local_31);
  pVVar1 = makeSymbol(this,&local_30);
  this->OR = pVVar1;
  std::__cxx11::string::~string((string *)&local_30);
  Kgc::pushStackRoot(this_00,this->OR);
  pVVar1 = makeEofObject(this);
  this->EOFOBJ = pVVar1;
  Kgc::pushStackRoot(this_00,pVVar1);
  this->EMPTY_ENV = this->NIL;
  pVVar1 = makeEnvironment(this);
  this->GLOBAL_ENV = pVVar1;
  Kgc::pushStackRoot(this_00,pVVar1);
  return;
}

Assistant:

void Kvm::initialize()
{
    NIL   = makeNil();
    GC_PROTECT(NIL);
    
    FALSE = makeBool(false);
    GC_PROTECT(FALSE);
    
    TRUE  = makeBool(true);
    GC_PROTECT(TRUE);
    
    QUOTE = makeSymbol("quote");
    GC_PROTECT(QUOTE);
    
    DEFINE= makeSymbol("define");
    GC_PROTECT(DEFINE);
    
    SET   = makeSymbol("set!");
    GC_PROTECT(SET);
    
    OK    = makeSymbol("ok");
    GC_PROTECT(OK);
    
    IF    = makeSymbol("if");
    GC_PROTECT(IF);
    
    LAMBDA= makeSymbol("lambda");
    GC_PROTECT(LAMBDA);
    
    BEGIN = makeSymbol("begin");
    GC_PROTECT(BEGIN);
    
    COND  = makeSymbol("cond");
    GC_PROTECT(COND);
    
    ELSE  = makeSymbol("else");
    GC_PROTECT(ELSE);
    
    LET   = makeSymbol("let");
    GC_PROTECT(LET);
    
    AND   = makeSymbol("and");
    GC_PROTECT(AND);
    
    OR    = makeSymbol("or");
    GC_PROTECT(OR);
    
    EOFOBJ= makeEofObject();
    GC_PROTECT(EOFOBJ);
    
    EMPTY_ENV = NIL; // already protected
    GLOBAL_ENV= makeEnvironment();
    GC_PROTECT(GLOBAL_ENV);
}